

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::AddAllNodes
          (ChContactSurfaceNodeCloud *this,double point_radius)

{
  ChMesh *pCVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  uint uVar8;
  ulong uVar9;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_68;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_58;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  double local_38;
  
  pCVar1 = (this->super_ChContactSurface).m_mesh;
  if ((pCVar1 != (ChMesh *)0x0) &&
     (local_38 = point_radius,
     iVar2 = (*(pCVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])(),
     iVar2 != 0)) {
    uVar9 = 0;
    do {
      pCVar1 = (this->super_ChContactSurface).m_mesh;
      (*(pCVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                (&local_48,pCVar1,uVar9);
      if ((local_48 == 0) ||
         (peVar4 = (element_type *)
                   __dynamic_cast(local_48,&ChNodeBase::typeinfo,&ChNodeFEAxyz::typeinfo,
                                  0xffffffffffffffff), peVar4 == (element_type *)0x0)) {
        peVar4 = (element_type *)0x0;
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00625dd4:
        if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
        }
        if (peVar4 != (element_type *)0x0) {
          local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = peVar4;
          local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var7;
          if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00625ecb;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
          goto LAB_00625ed5;
        }
        pCVar1 = (this->super_ChContactSurface).m_mesh;
        (*(pCVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                  (&local_48,pCVar1,uVar9);
        if ((local_48 == 0) ||
           (peVar5 = (element_type *)
                     __dynamic_cast(local_48,&ChNodeBase::typeinfo,&ChNodeFEAxyzrot::typeinfo,
                                    0xffffffffffffffff), peVar5 == (element_type *)0x0)) {
          peVar5 = (element_type *)0x0;
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00625e7d:
          if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
          }
          if (peVar5 != (element_type *)0x0) {
            local_68.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = peVar5;
            local_68.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = _Var6._M_pi;
            if (_Var6._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
            goto LAB_00625f39;
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Var6._M_pi)->_M_use_count = (_Var6._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Var6._M_pi)->_M_use_count = (_Var6._M_pi)->_M_use_count + 1;
            }
            goto LAB_00625f49;
          }
        }
        else {
          if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            _Var6._M_pi = local_40;
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_40->_M_use_count = local_40->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_40->_M_use_count = local_40->_M_use_count + 1;
            }
            goto LAB_00625e7d;
          }
          local_68.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_68.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar5;
LAB_00625f39:
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00625f49:
          AddNode(this,&local_68,local_38);
          if (local_68.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      else {
        if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var7 = local_40;
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_40->_M_use_count = local_40->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_40->_M_use_count = local_40->_M_use_count + 1;
          }
          goto LAB_00625dd4;
        }
        local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar4;
LAB_00625ecb:
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00625ed5:
        AddNode(this,&local_58,local_38);
        _Var6._M_pi = local_58.
                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
      uVar3 = (*(((this->super_ChContactSurface).m_mesh)->super_ChIndexedNodes).super_ChPhysicsItem.
                super_ChObj._vptr_ChObj[0x3c])();
    } while (uVar8 < uVar3);
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::AddAllNodes(const double point_radius) {
    if (!m_mesh)
        return;
    for (unsigned int i = 0; i < m_mesh->GetNnodes(); ++i)
        if (auto mnodeFEA = std::dynamic_pointer_cast<ChNodeFEAxyz>(m_mesh->GetNode(i)))
            this->AddNode(mnodeFEA, point_radius);
        else if (auto mnodeFEArot = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(m_mesh->GetNode(i)))
            this->AddNode(mnodeFEArot, point_radius);
}